

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnumVal.cpp
# Opt level: O0

void usage(void)

{
  ostream *this;
  
  this = std::operator<<((ostream *)&std::cout,
                         "\nUsage:\n    EnumVal <XML file>\n\nThis program parses the specified XML file, then shows how to\nenumerate the contents of the DTD Grammar. Essentially,\nshows how one can access the DTD information stored in internal\ndata structures.\n"
                        );
  std::ostream::operator<<((ostream *)this,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void usage()
{
    std::cout << "\nUsage:\n"
            "    EnumVal <XML file>\n\n"
            "This program parses the specified XML file, then shows how to\n"
            "enumerate the contents of the DTD Grammar. Essentially,\n"
            "shows how one can access the DTD information stored in internal\n"
            "data structures.\n"
         << std::endl;
}